

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O1

ClampedReLULayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_clampedrelu(NeuralNetworkLayer *this)

{
  ClampedReLULayerParams *this_00;
  
  if (this->_oneof_case_[0] != 0x5b4) {
    clear_layer(this);
    this->_oneof_case_[0] = 0x5b4;
    this_00 = (ClampedReLULayerParams *)operator_new(0x20);
    ClampedReLULayerParams::ClampedReLULayerParams(this_00);
    (this->layer_).clampedrelu_ = this_00;
  }
  return (ClampedReLULayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::ClampedReLULayerParams* NeuralNetworkLayer::mutable_clampedrelu() {
  if (!has_clampedrelu()) {
    clear_layer();
    set_has_clampedrelu();
    layer_.clampedrelu_ = new ::CoreML::Specification::ClampedReLULayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.clampedReLU)
  return layer_.clampedrelu_;
}